

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signals.c
# Opt level: O0

void setup_signals(sigaction *signal_action,int flags)

{
  undefined4 in_ESI;
  long in_RDI;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  *(undefined4 *)(in_RDI + 0x88) = 0x10000000;
  sigemptyset((sigset_t *)(in_RDI + 8));
  setup_ignored_signals
            ((sigaction *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  sigemptyset((sigset_t *)(in_RDI + 8));
  setup_blocked_signals
            ((sigaction *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  return;
}

Assistant:

void setup_signals(struct sigaction *signal_action, int flags) {
	// Let system calls restart when it
	// was interrupted by a signal
	signal_action->sa_flags = SA_RESTART;

	// Clear all flags
	sigemptyset(&signal_action->sa_mask);

	setup_ignored_signals(signal_action, flags);

	// Clear all flags
	sigemptyset(&signal_action->sa_mask);

	setup_blocked_signals(signal_action, flags);
}